

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O0

void __thiscall test_iir_filter::test_method(test_iir_filter *this)

{
  undefined8 uVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  lazy_ostream *prev;
  reference pvVar5;
  reference pvVar6;
  double local_2d0;
  double local_2c8;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2b0;
  basic_cstring<const_char> local_288 [2];
  basic_cstring<const_char> local_268;
  size_type local_258;
  size_t counter;
  iir_filter<6> lp;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_170;
  undefined1 local_f8 [8];
  array<double,_7UL> a;
  array<double,_7UL> b;
  double gain;
  array<double,_7UL> response;
  array<double,_7UL> signal;
  test_iir_filter *this_local;
  
  memset(response._M_elems + 6,0,0x38);
  response._M_elems[6] = 1.0;
  memcpy(&gain,&DAT_00136210,0x38);
  butter_lp<6>(&local_170,2048000.0,40000.0);
  std::tie<double,std::array<double,7ul>,std::array<double,7ul>>
            ((tuple<double_&,_std::array<double,_7UL>_&,_std::array<double,_7UL>_&> *)
             &lp.yv_m.m_size,b._M_elems + 6,(array<double,_7UL> *)(a._M_elems + 6),
             (array<double,_7UL> *)local_f8);
  std::tuple<double&,std::array<double,7ul>&,std::array<double,7ul>&>::operator=
            ((tuple<double&,std::array<double,7ul>&,std::array<double,7ul>&> *)&lp.yv_m.m_size,
             &local_170);
  iir_filter<6>::iir_filter
            ((iir_filter<6> *)&counter,b._M_elems[6],(array<double,_7UL> *)(a._M_elems + 6),
             (array<double,_7UL> *)local_f8);
  for (local_258 = 0; sVar2 = local_258,
      sVar4 = std::array<double,_7UL>::size((array<double,_7UL> *)(response._M_elems + 6)),
      sVar2 != sVar4; local_258 = local_258 + 1) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(local_288);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x40,local_288);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_2b0,prev,(char (*) [1])0x136a06);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      pvVar5 = std::array<double,_7UL>::operator[]((array<double,_7UL> *)&gain,local_258);
      pvVar6 = std::array<double,_7UL>::operator[]
                         ((array<double,_7UL> *)(response._M_elems + 6),local_258);
      local_2c8 = iir_filter<6>::operator()((iir_filter<6> *)&counter,*pvVar6);
      local_2d0 = (double)boost::math::fpc::percent_tolerance<double>(1e-12);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
                (&local_2b0,&local_2c0,0x40,1,8,pvVar5,"response[counter]",&local_2c8,
                 "lp(signal[counter])",&local_2d0,"::boost::math::fpc::percent_tolerance(1e-12)");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_2b0);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  iir_filter<6>::~iir_filter((iir_filter<6> *)&counter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_iir_filter)
{
    std::array<double, 7> signal = { 1.0 };
    // generated with octave signal package
    // >> pkg load signal;
    // >> [b,a] = butter(6, 2*40000/2048000);
    // >> v = impz(b, a, 7)
    std::array<double, 7> response = {
        4.24141395075581e-08, 4.88861571352154e-07, 2.79723456125130e-06,
        1.07425029331562e-05, 3.15672364704611e-05, 7.65594176229739e-05,
        1.60949149809997e-04
    };
    double gain;
    std::array<double, 7 > b;
    std::array<double, 7 > a;

    std::tie(gain, b, a) = butter_lp<6>(2048000, 40000);
    iir_filter<6> lp(gain, b, a);
    for(size_t counter = 0; counter != signal.size(); ++counter)
    {
        BOOST_CHECK_CLOSE(response[counter], lp(signal[counter]), 1e-12);
    }
}